

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O2

void __thiscall Liby::PollerSelect::removeChanel(PollerSelect *this,Channel *ch)

{
  __fd_mask *p_Var1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  Logger *this_00;
  uint uVar5;
  uint uVar6;
  double __x;
  
  if (ch != (Channel *)0x0) {
    uVar6 = ch->fd_;
    if (-1 < (int)uVar6) {
      bVar2 = (byte)uVar6 & 0x3f;
      uVar4 = -2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2;
      uVar5 = uVar6 >> 6;
      p_Var1 = (this->rset_).fds_bits + uVar5;
      *p_Var1 = *p_Var1 & uVar4;
      p_Var1 = (this->wset_).fds_bits + uVar5;
      *p_Var1 = *p_Var1 & uVar4;
      p_Var1 = (this->eset_).fds_bits + uVar5;
      *p_Var1 = *p_Var1 & uVar4;
      this_00 = Logger::getLogger();
      Logger::log(this_00,__x);
      (this->super_Poller).channels_.
      super__Vector_base<Liby::Channel_*,_std::allocator<Liby::Channel_*>_>._M_impl.
      super__Vector_impl_data._M_start[uVar6] = (Channel *)0x0;
      if (uVar6 == this->maxfd_) {
        while (uVar6 = uVar6 - 1, uVar6 != 0) {
          iVar3 = (int)uVar6 / 0x40;
          uVar4 = 1L << ((byte)((long)(int)uVar6 % 0x40) & 0x3f);
          if (((((ulong)(this->rset_).fds_bits[iVar3] >> ((long)(int)uVar6 % 0x40 & 0x3fU) & 1) != 0
               ) || (((this->wset_).fds_bits[iVar3] & uVar4) != 0)) ||
             (((this->eset_).fds_bits[iVar3] & uVar4) != 0)) break;
        }
        this->maxfd_ = uVar6;
      }
      return;
    }
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                ,0x30,"virtual void Liby::PollerSelect::removeChanel(Channel *)");
}

Assistant:

void PollerSelect::removeChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    FD_CLR(fd, &rset_);
    FD_CLR(fd, &wset_);
    FD_CLR(fd, &eset_);

    verbose("try to remove fd %d channel %p", fd, ch);

    setChannel(fd, nullptr);

    if (fd == maxfd_) {
        while (--maxfd_) {
            if (FD_ISSET(maxfd_, &rset_) || FD_ISSET(maxfd_, &wset_) ||
                FD_ISSET(maxfd_, &eset_)) {
                break;
            }
        }
    }
}